

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O0

void __thiscall VPPOperator::RenderTitle(VPPOperator *this)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float title_size;
  VPPOperator *this_local;
  
  ImGui::SetNextItemWidth(150.0);
  fVar2 = ImGui::CalcItemWidth();
  fVar3 = ImGui::GetCursorPosX();
  ImGui::SetCursorPosX((fVar3 + (this->super_BaseNode).node_width / 2.0) - fVar2 / 2.0);
  bVar1 = ImGui::InputText("##command",&this->command,0x20,(ImGuiInputTextCallback)0x0,(void *)0x0);
  if (bVar1) {
    SetCommand(this,&this->command);
  }
  return;
}

Assistant:

virtual void RenderTitle() override
    {
        ImGui::SetNextItemWidth(150);

        float title_size = ImGui::CalcItemWidth();
        ImGui::SetCursorPosX(ImGui::GetCursorPosX() + node_width / 2.f - title_size / 2.f);

        if (ImGui::InputText("##command", &command, ImGuiInputTextFlags_EnterReturnsTrue)) {
            SetCommand(command);
        }
    }